

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::miniz::mz_zip_reader_sort_central_dir_offsets_by_filename(mz_zip_archive *pZip)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 uVar4;
  mz_zip_internal_state *pmVar5;
  undefined4 *puVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  mz_uint32 t;
  byte bVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  
  pmVar5 = pZip->m_pState;
  puVar6 = (undefined4 *)(pmVar5->m_sorted_central_dir_offsets).m_p;
  uVar24 = pZip->m_total_files;
  iVar13 = (int)(uVar24 - 2) >> 1;
  if (-1 < iVar13) {
    do {
      iVar21 = iVar13 * 2 + 1;
      if (iVar21 < (int)uVar24) {
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        iVar22 = iVar13;
        do {
          iVar14 = iVar22 * 2 + 2;
          uVar23 = 0;
          if (iVar14 < (int)uVar24) {
            pvVar9 = (pmVar5->m_central_dir).m_p;
            pvVar10 = (pmVar5->m_central_dir_offsets).m_p;
            uVar20 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar21] * 4);
            uVar15 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar14] * 4);
            pbVar25 = (byte *)((long)pvVar9 + uVar20 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar20 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar15 + 0x1c);
            uVar23 = (uint)uVar3;
            if ((uint)uVar2 < (uint)uVar3) {
              uVar23 = (uint)uVar2;
            }
            pbVar26 = (byte *)((long)pvVar9 + uVar23 + uVar20 + 0x2e);
            if (uVar23 == 0) {
              bVar19 = 0;
              bVar12 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar15 + 0x2e);
              do {
                bVar12 = *pbVar25;
                bVar19 = bVar12 + 0x20;
                if (0x19 < (byte)(bVar12 + 0xbf)) {
                  bVar19 = bVar12;
                }
                bVar1 = *pbVar27;
                bVar12 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar12 = bVar1;
                }
                if (bVar19 != bVar12) break;
                pbVar25 = pbVar25 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar25 < pbVar26);
            }
            bVar18 = bVar19 < bVar12;
            if (pbVar25 == pbVar26) {
              bVar18 = uVar2 < uVar3;
            }
            uVar23 = (uint)bVar18;
          }
          iVar14 = uVar23 + iVar21;
          uVar23 = puVar6[iVar22];
          uVar15 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar23 * 4);
          uVar20 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar14] * 4);
          pbVar25 = (byte *)((long)pvVar7 + uVar15 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar15 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar20 + 0x1c);
          uVar11 = (uint)uVar3;
          if ((uint)uVar2 < (uint)uVar3) {
            uVar11 = (uint)uVar2;
          }
          pbVar26 = (byte *)((long)pvVar7 + uVar11 + uVar15 + 0x2e);
          if (uVar11 == 0) {
            bVar19 = 0;
            bVar12 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar7 + uVar20 + 0x2e);
            do {
              bVar12 = *pbVar25;
              bVar19 = bVar12 + 0x20;
              if (0x19 < (byte)(bVar12 + 0xbf)) {
                bVar19 = bVar12;
              }
              bVar1 = *pbVar27;
              bVar12 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar12 = bVar1;
              }
              if (bVar19 != bVar12) break;
              pbVar25 = pbVar25 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar25 < pbVar26);
          }
          bVar18 = bVar12 <= bVar19;
          if (pbVar25 == pbVar26) {
            bVar18 = uVar3 <= uVar2;
          }
          if (bVar18) break;
          puVar6[iVar22] = puVar6[iVar14];
          puVar6[iVar14] = uVar23;
          iVar21 = iVar14 * 2 + 1;
          iVar22 = iVar14;
        } while (iVar21 < (int)uVar24);
      }
      bVar18 = 0 < iVar13;
      iVar13 = iVar13 + -1;
    } while (bVar18);
  }
  uVar15 = (ulong)uVar24;
  if (1 < (int)uVar24) {
    do {
      uVar20 = uVar15 - 1;
      uVar4 = puVar6[uVar15 - 1];
      puVar6[uVar15 - 1] = *puVar6;
      *puVar6 = uVar4;
      if (2 < (long)uVar15) {
        pvVar7 = (pmVar5->m_central_dir).m_p;
        pvVar8 = (pmVar5->m_central_dir_offsets).m_p;
        iVar13 = 0;
        iVar22 = 1;
        iVar21 = 0;
        do {
          uVar24 = 0;
          if ((long)(iVar13 + 2) < (long)uVar20) {
            pvVar9 = (pmVar5->m_central_dir).m_p;
            pvVar10 = (pmVar5->m_central_dir_offsets).m_p;
            uVar17 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar22] * 4);
            uVar16 = (ulong)*(uint *)((long)pvVar10 + (ulong)(uint)puVar6[iVar13 + 2] * 4);
            pbVar25 = (byte *)((long)pvVar9 + uVar17 + 0x2e);
            uVar2 = *(ushort *)((long)pvVar9 + uVar17 + 0x1c);
            uVar3 = *(ushort *)((long)pvVar9 + uVar16 + 0x1c);
            uVar24 = (uint)uVar3;
            if ((uint)uVar2 < (uint)uVar3) {
              uVar24 = (uint)uVar2;
            }
            pbVar26 = (byte *)((long)pvVar9 + uVar24 + uVar17 + 0x2e);
            if (uVar24 == 0) {
              bVar19 = 0;
              bVar12 = 0;
            }
            else {
              pbVar27 = (byte *)((long)pvVar9 + uVar16 + 0x2e);
              do {
                bVar12 = *pbVar25;
                bVar19 = bVar12 + 0x20;
                if (0x19 < (byte)(bVar12 + 0xbf)) {
                  bVar19 = bVar12;
                }
                bVar1 = *pbVar27;
                bVar12 = bVar1 + 0x20;
                if (0x19 < (byte)(bVar1 + 0xbf)) {
                  bVar12 = bVar1;
                }
                if (bVar19 != bVar12) break;
                pbVar25 = pbVar25 + 1;
                pbVar27 = pbVar27 + 1;
              } while (pbVar25 < pbVar26);
            }
            bVar18 = bVar19 < bVar12;
            if (pbVar25 == pbVar26) {
              bVar18 = uVar2 < uVar3;
            }
            uVar24 = (uint)bVar18;
          }
          iVar14 = uVar24 + iVar22;
          uVar24 = puVar6[iVar21];
          uVar16 = (ulong)*(uint *)((long)pvVar8 + (ulong)uVar24 * 4);
          uVar17 = (ulong)*(uint *)((long)pvVar8 + (ulong)(uint)puVar6[iVar14] * 4);
          pbVar25 = (byte *)((long)pvVar7 + uVar16 + 0x2e);
          uVar2 = *(ushort *)((long)pvVar7 + uVar16 + 0x1c);
          uVar3 = *(ushort *)((long)pvVar7 + uVar17 + 0x1c);
          uVar23 = (uint)uVar3;
          if ((uint)uVar2 < (uint)uVar3) {
            uVar23 = (uint)uVar2;
          }
          pbVar26 = (byte *)((long)pvVar7 + uVar23 + uVar16 + 0x2e);
          if (uVar23 == 0) {
            bVar19 = 0;
            bVar12 = 0;
          }
          else {
            pbVar27 = (byte *)((long)pvVar7 + uVar17 + 0x2e);
            do {
              bVar12 = *pbVar25;
              bVar19 = bVar12 + 0x20;
              if (0x19 < (byte)(bVar12 + 0xbf)) {
                bVar19 = bVar12;
              }
              bVar1 = *pbVar27;
              bVar12 = bVar1 + 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar12 = bVar1;
              }
              if (bVar19 != bVar12) break;
              pbVar25 = pbVar25 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar25 < pbVar26);
          }
          bVar18 = bVar12 <= bVar19;
          if (pbVar25 == pbVar26) {
            bVar18 = uVar3 <= uVar2;
          }
          if (bVar18) break;
          puVar6[iVar21] = puVar6[iVar14];
          puVar6[iVar14] = uVar24;
          iVar13 = iVar14 * 2;
          iVar22 = iVar14 * 2 + 1;
          iVar21 = iVar14;
        } while ((long)iVar22 < (long)uVar20);
      }
      bVar18 = 2 < (long)uVar15;
      uVar15 = uVar20;
    } while (bVar18);
  }
  return;
}

Assistant:

static void mz_zip_reader_sort_central_dir_offsets_by_filename(
    mz_zip_archive *pZip) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(
      &pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const int size = pZip->m_total_files;
  int start = (size - 2) >> 1, end;
  while (start >= 0) {
    int child, root = start;
    for (;;) {
      if ((child = (root << 1) + 1) >= size) break;
      child +=
          (((child + 1) < size) &&
           (mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                        pIndices[child], pIndices[child + 1])));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    start--;
  }

  end = size - 1;
  while (end > 0) {
    int child, root = 0;
    MZ_SWAP_UINT32(pIndices[end], pIndices[0]);
    for (;;) {
      if ((child = (root << 1) + 1) >= end) break;
      child +=
          (((child + 1) < end) &&
           mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[child], pIndices[child + 1]));
      if (!mz_zip_reader_filename_less(pCentral_dir, pCentral_dir_offsets,
                                       pIndices[root], pIndices[child]))
        break;
      MZ_SWAP_UINT32(pIndices[root], pIndices[child]);
      root = child;
    }
    end--;
  }
}